

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void jsonAppendRaw(JsonString *p,char *zIn,u32 N)

{
  ulong __n;
  
  if (N != 0) {
    __n = (ulong)N;
    if (p->nAlloc <= p->nUsed + __n) {
      jsonStringExpandAndAppend(p,zIn,N);
      return;
    }
    memcpy(p->zBuf + p->nUsed,zIn,__n);
    p->nUsed = p->nUsed + __n;
  }
  return;
}

Assistant:

static void jsonAppendRaw(JsonString *p, const char *zIn, u32 N){
  if( N==0 ) return;
  if( N+p->nUsed >= p->nAlloc ){
    jsonStringExpandAndAppend(p,zIn,N);
  }else{
    memcpy(p->zBuf+p->nUsed, zIn, N);
    p->nUsed += N;
  }
}